

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void menu(bool *bots,bool *player1,bool *player2)

{
  int iVar1;
  string num;
  long *local_58 [2];
  long local_48 [2];
  bool *local_38;
  
  local_58[0] = local_48;
  local_38 = player2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"0","");
  iVar1 = std::__cxx11::string::compare((char *)local_58);
  if (iVar1 != 0) {
    do {
      iVar1 = std::__cxx11::string::compare((char *)local_58);
      if (iVar1 == 0) break;
      iVar1 = std::__cxx11::string::compare((char *)local_58);
      if (iVar1 == 0) break;
      iVar1 = std::__cxx11::string::compare((char *)local_58);
      if (iVar1 == 0) break;
      system("clear");
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"********(",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MENU",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")********",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.alone bots",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"2.one player by bots",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.two player",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"4.two player by bots",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"**********************",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Select the number you want : ",0x1d);
      std::operator>>((istream *)&std::cin,(string *)local_58);
      iVar1 = std::__cxx11::string::compare((char *)local_58);
      if (iVar1 == 0) {
LAB_00104070:
        *bots = true;
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (iVar1 == 0) {
LAB_00104092:
          *player1 = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_58);
          if (iVar1 == 0) goto LAB_00104092;
        }
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (iVar1 == 0) goto LAB_001040a9;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (iVar1 == 0) goto LAB_00104070;
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (iVar1 == 0) goto LAB_00104070;
        *player1 = true;
LAB_001040a9:
        *local_38 = true;
      }
      iVar1 = std::__cxx11::string::compare((char *)local_58);
    } while (iVar1 != 0);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void menu(bool& bots, bool& player1, bool& player2)
{
    string num = "0"; 
    while(num != "1" and num != "2" and num != "3" and num != "4") 
    { 
        system("clear"); 
        cout << "********(" << "MENU" << ")********" << endl; 
        cout << "1.alone bots" << endl; 
        cout << "2.one player by bots" << endl; 
        cout << "3.two player" << endl; 
        cout << "4.two player by bots" << endl; 
        cout << "**********************" << endl; 
        cout << "Select the number you want : "; 

        cin >> num; 

		if(num == "1" or num == "2" or num == "4")
		{
			bots = true;
			if(num == "2" or num == "4")
				player1 = true;
			if(num == "4")
				player2 = true;
		}
		else
		{
			player1 = true;	
			player2 = true;
		}
	}
}